

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.hpp
# Opt level: O3

double units::convert<units::precise_unit,units::precise_unit>
                 (double val,precise_unit *start,precise_unit *result,double baseValue)

{
  double dVar1;
  unit_data uVar2;
  unit_data uVar3;
  double dVar4;
  bool bVar5;
  unit local_20;
  unit local_18;
  
  bVar5 = precise_unit::operator==(start,result);
  dVar4 = val;
  if (!bVar5) {
    dVar1 = start->multiplier_;
    uVar2 = start->base_units_;
    if (dVar1 != 1.0 || uVar2 != (unit_data)0x30000000) {
      uVar3 = result->base_units_;
      if (result->multiplier_ != 1.0 || uVar3 != (unit_data)0x30000000) {
        if (uVar3 == uVar2) {
          dVar4 = (dVar1 * val) / result->multiplier_;
        }
        else if ((((uint)uVar2 ^ (uint)uVar3) >> 0x1c & 1) == 0) {
          if ((((((uint)uVar2 | (uint)uVar3) >> 0x1e & 1) == 0) ||
              ((((uint)uVar3 ^ (uint)uVar2) & 0xfffffff) != 0)) ||
             (dVar4 = detail::convertFlaggedUnits<units::precise_unit,units::precise_unit>
                                (val,start,result,baseValue), NAN(dVar4))) {
            dVar4 = convert<units::precise_unit,units::precise_unit>(val,start,result);
            return dVar4;
          }
        }
        else {
          if ((((uint)uVar3 ^ (uint)uVar2) & 0xfffffff) != 0) {
            local_18.base_units_ = uVar2;
            local_18.multiplier_ = (float)dVar1;
            bVar5 = unit::operator==((unit *)&pu,&local_18);
            if (!bVar5) {
              local_20.multiplier_ = (float)result->multiplier_;
              local_20.base_units_ = result->base_units_;
              bVar5 = unit::operator==((unit *)&pu,&local_20);
              if (!bVar5) {
                return NAN;
              }
            }
          }
          if (((start->base_units_).field_0x3 & 0x10) != 0) {
            val = val * baseValue;
          }
          dVar4 = (val * start->multiplier_) / result->multiplier_;
          if (((result->base_units_).field_0x3 & 0x10) != 0) {
            dVar4 = dVar4 / baseValue;
          }
        }
      }
    }
  }
  return dVar4;
}

Assistant:

double convert(double val, const UX& start, const UX2& result, double baseValue)
{
    static_assert(
        std::is_same<UX, unit>::value || std::is_same<UX, precise_unit>::value,
        "convert argument types must be unit or precise_unit");
    static_assert(
        std::is_same<UX2, unit>::value ||
            std::is_same<UX2, precise_unit>::value,
        "convert argument types must be unit or precise_unit");
    if (start == result || is_default(start) || is_default(result)) {
        return val;
    }
    if (start.base_units() == result.base_units()) {
        return val * start.multiplier() / result.multiplier();
    }

    // if the per unit is equivalent, no baseValue is needed so give to first
    // function
    if (start.is_per_unit() == result.is_per_unit()) {
        if ((start.has_e_flag() || result.has_e_flag()) &&
            start.has_same_base(result.base_units())) {
            double converted_val =
                detail::convertFlaggedUnits(val, start, result, baseValue);
            if (!std::isnan(converted_val)) {
                return converted_val;
            }
        }
        return convert(val, start, result);
    }

    if (start.has_same_base(result.base_units()) || pu == unit_cast(start) ||
        pu == unit_cast(result)) {
        if (start.is_per_unit()) {
            val = val * baseValue;
        }
        val = val * start.multiplier() / result.multiplier();
        if (result.is_per_unit()) {
            val /= baseValue;
        }
        return val;
    }
    // this would require two base values which power might be assumed but
    // assuming a base voltage is dangerous
    return constants::invalid_conversion;
}